

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O2

size_t UpdateNodes(size_t num_bytes,size_t block_start,size_t pos,uint8_t *ringbuffer,
                  size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                  int *starting_dist_cache,size_t num_matches,BackwardMatch *matches,
                  ZopfliCostModel *model,StartPosQueue *queue,ZopfliNode *nodes)

{
  ulong uVar1;
  float fVar2;
  int iVar3;
  BackwardMatch BVar4;
  int iVar5;
  ushort uVar6;
  ZopfliNode *pZVar7;
  ulong uVar8;
  size_t sVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  anon_union_4_3_cc401a1e_for_u *paVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  size_t sVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ushort uVar29;
  int iVar30;
  ulong uVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  ZopfliNode *pZVar36;
  uint uVar37;
  bool bVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  ZopfliNode *in_stack_fffffffffffffef0;
  
  uVar1 = pos + block_start;
  uVar13 = uVar1 & ringbuffer_mask;
  sVar14 = max_backward_limit;
  if (uVar1 < max_backward_limit) {
    sVar14 = uVar1;
  }
  uVar8 = num_bytes - pos;
  iVar3 = params->quality;
  uVar20 = 0x145;
  if (iVar3 < 0xb) {
    uVar20 = 0x96;
  }
  EvaluateNode(block_start,pos,max_backward_limit,(size_t)starting_dist_cache,(int *)model,
               (ZopfliCostModel *)queue,(StartPosQueue *)nodes,in_stack_fffffffffffffef0);
  uVar23 = (ulong)((-(int)queue->idx_ & 7U) << 5);
  fVar40 = (model->literal_costs_[pos] -
           model->literal_costs_[*(long *)((long)queue->q_[0].distance_cache + (uVar23 - 8))]) +
           *(float *)((long)queue->q_[0].distance_cache + uVar23 + 0x14) + model->min_cost_cmd_;
  lVar19 = 10;
  lVar21 = 4;
  lVar25 = 3;
  for (paVar17 = &nodes[pos + 2].u; ((pos + lVar25) - 1 <= num_bytes && (paVar17->cost <= fVar40));
      paVar17 = paVar17 + 4) {
    bVar38 = lVar25 == lVar19;
    fVar39 = fVar40 + 1.0;
    if (!bVar38) {
      fVar39 = fVar40;
    }
    fVar40 = fVar39;
    lVar24 = 0;
    if (bVar38) {
      lVar24 = lVar21;
    }
    lVar21 = lVar21 << bVar38;
    lVar19 = lVar19 + lVar24;
    lVar25 = lVar25 + 1;
  }
  uVar23 = 0;
  sVar9 = 0;
  do {
    if (uVar23 == (ulong)(10 < iVar3) * 4 + 1) {
      return sVar9;
    }
    uVar15 = queue->idx_;
    uVar34 = 8;
    if (uVar15 < 8) {
      uVar34 = uVar15;
    }
    if (uVar34 <= uVar23) {
      return sVar9;
    }
    uVar34 = (ulong)(((int)uVar23 - (int)uVar15 & 7U) << 5);
    uVar15 = pos - *(long *)((long)queue->q_[0].distance_cache + (uVar34 - 8));
    fVar40 = (float)uVar15;
    if (uVar15 < 6) {
      uVar31 = uVar15 & 0xffffffff;
    }
    else if (uVar15 < 0x82) {
      uVar37 = 0x1f;
      uVar11 = (uint)(uVar15 - 2);
      if (uVar11 != 0) {
        for (; uVar11 >> uVar37 == 0; uVar37 = uVar37 - 1) {
        }
      }
      uVar31 = (ulong)((int)(uVar15 - 2 >> ((char)(uVar37 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar37 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (uVar15 < 0x842) {
      uVar37 = 0x1f;
      if ((int)fVar40 - 0x42U != 0) {
        for (; (int)fVar40 - 0x42U >> uVar37 == 0; uVar37 = uVar37 - 1) {
        }
      }
      uVar31 = (ulong)((uVar37 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar31 = 0x15;
      if (0x1841 < uVar15) {
        uVar31 = (ulong)(ushort)(0x17 - (uVar15 < 0x5842));
      }
    }
    fVar39 = (model->literal_costs_[pos] - *model->literal_costs_) +
             (float)kInsExtra[uVar31 & 0xffff] +
             *(float *)((long)queue->q_[0].distance_cache + uVar34 + 0x10);
    uVar37 = (int)uVar31 * 8 & 0x38;
    iVar5 = (int)((uVar31 & 0xffff) >> 3) * 3;
    uVar35 = 0;
    uVar15 = lVar25 - 2;
    while (((uVar35 < 0x10 && (uVar15 < uVar8)) && (uVar15 + uVar13 <= ringbuffer_mask))) {
      uVar26 = (long)kDistanceCacheOffset[uVar35] +
               (long)*(int *)((long)queue->q_[0].distance_cache +
                             (ulong)kDistanceCacheIndex[uVar35] * 4 + uVar34);
      if (uVar1 - uVar26 < uVar1 && uVar26 <= sVar14) {
        uVar16 = uVar1 - uVar26 & ringbuffer_mask;
        if ((uVar16 + uVar15 <= ringbuffer_mask) &&
           (ringbuffer[uVar15 + uVar13] == ringbuffer[uVar16 + uVar15])) {
          uVar27 = 0;
          lVar19 = 0;
          do {
            uVar18 = (ulong)((uint)uVar8 & 7);
            uVar28 = uVar8 & 0xfffffffffffffff8;
            if (uVar8 >> 3 == uVar27) {
              for (; (uVar27 = uVar8, uVar18 != 0 &&
                     (uVar27 = uVar28, ringbuffer[uVar28 + uVar16] == ringbuffer[uVar28 + uVar13]));
                  uVar28 = uVar28 + 1) {
                uVar18 = uVar18 - 1;
              }
LAB_0010bbc9:
              fVar2 = model->cost_dist_[uVar35];
              do {
                iVar32 = (int)uVar15;
                lVar19 = 0;
                pZVar7 = nodes + pos + uVar15;
                do {
                  pZVar36 = pZVar7;
                  uVar16 = uVar15 + lVar19 + 1;
                  if (uVar27 < uVar16) {
                    uVar15 = uVar15 + lVar19;
                    goto LAB_0010bd9b;
                  }
                  iVar30 = (int)lVar19;
                  if (uVar16 < 10) {
                    uVar11 = (iVar32 + iVar30) - 1;
                  }
                  else if (uVar16 < 0x86) {
                    uVar12 = iVar32 + -5 + iVar30;
                    uVar11 = 0x1f;
                    if (uVar12 != 0) {
                      for (; uVar12 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                      }
                    }
                    uVar11 = (int)((uVar15 + lVar19) - 5 >>
                                  ((char)(uVar11 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                             (uVar11 ^ 0xffffffe0) * 2 + 0x42;
                  }
                  else {
                    uVar11 = 0x17;
                    if (uVar16 < 0x846) {
                      uVar12 = iVar32 + -0x45 + iVar30;
                      uVar11 = 0x1f;
                      if (uVar12 != 0) {
                        for (; uVar12 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                        }
                      }
                      uVar11 = (uVar11 ^ 0xffe0) + 0x2c;
                    }
                  }
                  uVar6 = (ushort)uVar11;
                  uVar29 = uVar6 & 7 | (ushort)uVar37;
                  if (uVar6 < 0x10 && (uVar35 == 0 && (ushort)uVar31 < 8)) {
                    if (7 < uVar6) {
                      uVar29 = uVar29 + 0x40;
                    }
                  }
                  else {
                    iVar30 = ((uVar11 & 0xffff) >> 3) + iVar5;
                    uVar29 = uVar29 + ((ushort)(0x520d40 >> ((char)iVar30 * '\x02' & 0x1fU)) & 0xc0)
                                      + (short)iVar30 * 0x40 + 0x40;
                  }
                  fVar41 = fVar39;
                  if (0x7f < uVar29) {
                    fVar41 = fVar2 + fVar39;
                  }
                  fVar41 = (float)kCopyExtra[uVar11 & 0xffff] + fVar41 + model->cost_cmd_[uVar29];
                  lVar19 = lVar19 + 1;
                  pZVar7 = pZVar36 + 1;
                } while (pZVar36[1].u.cost <= fVar41);
                uVar15 = uVar15 + lVar19;
                pZVar36[1].length = (uint)uVar15 | 0x12000000;
                pZVar36[1].distance = (uint32_t)uVar26;
                pZVar36[1].dcode_insert_length = (uint)fVar40 | (int)uVar35 * 0x8000000 + 0x8000000U
                ;
                pZVar36[1].u.cost = fVar41;
                if (sVar9 <= uVar15) {
                  sVar9 = uVar15;
                }
              } while( true );
            }
            if (*(ulong *)(ringbuffer + uVar27 * 8 + uVar13) !=
                *(ulong *)(ringbuffer + uVar27 * 8 + uVar16)) {
              uVar27 = *(ulong *)(ringbuffer + uVar27 * 8 + uVar16) ^
                       *(ulong *)(ringbuffer + uVar27 * 8 + uVar13);
              uVar16 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              uVar27 = (uVar16 >> 3 & 0x1fffffff) - lVar19;
              goto LAB_0010bbc9;
            }
            lVar19 = lVar19 + -8;
            uVar27 = uVar27 + 1;
          } while( true );
        }
      }
LAB_0010bd9b:
      uVar35 = uVar35 + 1;
    }
    if (uVar23 < 2) {
      uVar15 = lVar25 - 1;
      for (sVar22 = 0; sVar22 != num_matches; sVar22 = sVar22 + 1) {
        BVar4 = matches[sVar22];
        uVar26 = (ulong)BVar4 & 0xffffffff;
        uVar34 = uVar26 + 0xf;
        uVar35 = (ulong)(params->dist).num_direct_distance_codes;
        uVar31 = uVar35 + 0x10;
        if (uVar31 <= uVar34) {
          uVar11 = (params->dist).distance_postfix_bits;
          bVar10 = (byte)uVar11;
          uVar34 = ~uVar35 + uVar26 + (4L << (bVar10 & 0x3f));
          uVar12 = 0x1f;
          uVar33 = (uint)uVar34;
          if (uVar33 != 0) {
            for (; uVar33 >> uVar12 == 0; uVar12 = uVar12 - 1) {
            }
          }
          uVar35 = (ulong)((uVar12 ^ 0xffffffe0) + 0x1f);
          lVar19 = uVar35 - uVar11;
          uVar34 = (~(-1 << (bVar10 & 0x1f)) & uVar33) + uVar31 +
                   (lVar19 * 2 + -2 + (ulong)((uVar34 >> (uVar35 & 0x3f) & 1) != 0) <<
                   (bVar10 & 0x3f)) | lVar19 * 0x400;
        }
        uVar35 = (ulong)BVar4 >> 0x25;
        uVar31 = uVar15;
        if (uVar20 < uVar35) {
          uVar31 = uVar35;
        }
        fVar2 = model->cost_dist_[(uint)uVar34 & 0x3ff];
        if (sVar14 < uVar26) {
          uVar31 = uVar35;
        }
        if (uVar15 < uVar35) {
          uVar15 = uVar31;
        }
        uVar31 = (ulong)(BVar4.length_and_code & 0x1f);
        if (((ulong)BVar4 & 0x1f00000000) == 0) {
          uVar31 = uVar35;
        }
        paVar17 = &nodes[pos + uVar15].u;
        lVar19 = uVar15 * 0x2000000 + 0x12000000;
        for (; uVar15 <= uVar35; uVar15 = uVar15 + 1) {
          uVar16 = uVar15;
          if (sVar14 < uVar26) {
            uVar16 = uVar31;
          }
          iVar32 = (int)uVar16;
          if (uVar16 < 10) {
            uVar11 = iVar32 - 2;
          }
          else if (uVar16 < 0x86) {
            uVar11 = 0x1f;
            uVar12 = (uint)(uVar16 - 6);
            if (uVar12 != 0) {
              for (; uVar12 >> uVar11 == 0; uVar11 = uVar11 - 1) {
              }
            }
            uVar11 = (int)(uVar16 - 6 >> ((char)(uVar11 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar11 ^ 0xffffffe0) * 2 + 0x42;
          }
          else {
            uVar11 = 0x17;
            if (uVar16 < 0x846) {
              uVar11 = 0x1f;
              if (iVar32 - 0x46U != 0) {
                for (; iVar32 - 0x46U >> uVar11 == 0; uVar11 = uVar11 - 1) {
                }
              }
              uVar11 = (uVar11 ^ 0xffe0) + 0x2c;
            }
          }
          iVar30 = ((uVar11 & 0xffff) >> 3) + iVar5;
          fVar41 = (float)kCopyExtra[uVar11 & 0xffff] +
                   (float)((uint)(uVar34 >> 10) & 0x3f) + fVar39 + fVar2 +
                   model->cost_cmd_
                   [uVar37 + ((0x520d40U >> ((char)iVar30 * '\x02' & 0x1fU) & 0xc0) + iVar30 * 0x40
                             | uVar11 & 7) + 0x40 & 0xffff];
          if (fVar41 < paVar17->cost) {
            ((ZopfliNode *)(paVar17 + -3))->length =
                 (uint)uVar15 | (int)lVar19 + iVar32 * -0x2000000;
            paVar17[-2].next = BVar4.distance;
            paVar17[-1].next = (uint32_t)fVar40;
            paVar17->cost = fVar41;
            if (sVar9 <= uVar15) {
              sVar9 = uVar15;
            }
          }
          paVar17 = paVar17 + 4;
          lVar19 = lVar19 + 0x2000000;
        }
      }
    }
    uVar23 = uVar23 + 1;
  } while( true );
}

Assistant:

static size_t UpdateNodes(
    const size_t num_bytes, const size_t block_start, const size_t pos,
    const uint8_t* ringbuffer, const size_t ringbuffer_mask,
    const BrotliEncoderParams* params, const size_t max_backward_limit,
    const int* starting_dist_cache, const size_t num_matches,
    const BackwardMatch* matches, const ZopfliCostModel* model,
    StartPosQueue* queue, ZopfliNode* nodes) {
  const size_t cur_ix = block_start + pos;
  const size_t cur_ix_masked = cur_ix & ringbuffer_mask;
  const size_t max_distance = BROTLI_MIN(size_t, cur_ix, max_backward_limit);
  const size_t max_len = num_bytes - pos;
  const size_t max_zopfli_len = MaxZopfliLen(params);
  const size_t max_iters = MaxZopfliCandidates(params);
  size_t min_len;
  size_t result = 0;
  size_t k;
  size_t gap = 0;

  EvaluateNode(block_start, pos, max_backward_limit, gap, starting_dist_cache,
      model, queue, nodes);

  {
    const PosData* posdata = StartPosQueueAt(queue, 0);
    float min_cost = (posdata->cost + ZopfliCostModelGetMinCostCmd(model) +
        ZopfliCostModelGetLiteralCosts(model, posdata->pos, pos));
    min_len = ComputeMinimumCopyLength(min_cost, nodes, num_bytes, pos);
  }

  /* Go over the command starting positions in order of increasing cost
     difference. */
  for (k = 0; k < max_iters && k < StartPosQueueSize(queue); ++k) {
    const PosData* posdata = StartPosQueueAt(queue, k);
    const size_t start = posdata->pos;
    const uint16_t inscode = GetInsertLengthCode(pos - start);
    const float start_costdiff = posdata->costdiff;
    const float base_cost = start_costdiff + (float)GetInsertExtra(inscode) +
        ZopfliCostModelGetLiteralCosts(model, 0, pos);

    /* Look for last distance matches using the distance cache from this
       starting position. */
    size_t best_len = min_len - 1;
    size_t j = 0;
    for (; j < BROTLI_NUM_DISTANCE_SHORT_CODES && best_len < max_len; ++j) {
      const size_t idx = kDistanceCacheIndex[j];
      const size_t backward =
          (size_t)(posdata->distance_cache[idx] + kDistanceCacheOffset[j]);
      size_t prev_ix = cur_ix - backward;
      size_t len = 0;
      uint8_t continuation = ringbuffer[cur_ix_masked + best_len];
      if (cur_ix_masked + best_len > ringbuffer_mask) {
        break;
      }
      if (BROTLI_PREDICT_FALSE(backward > max_distance + gap)) {
        continue;
      }
      if (backward <= max_distance) {
        if (prev_ix >= cur_ix) {
          continue;
        }

        prev_ix &= ringbuffer_mask;
        if (prev_ix + best_len > ringbuffer_mask ||
            continuation != ringbuffer[prev_ix + best_len]) {
          continue;
        }
        len = FindMatchLengthWithLimit(&ringbuffer[prev_ix],
                                       &ringbuffer[cur_ix_masked],
                                       max_len);
      } else {
        continue;
      }
      {
        const float dist_cost = base_cost +
            ZopfliCostModelGetDistanceCost(model, j);
        size_t l;
        for (l = best_len + 1; l <= len; ++l) {
          const uint16_t copycode = GetCopyLengthCode(l);
          const uint16_t cmdcode =
              CombineLengthCodes(inscode, copycode, j == 0);
          const float cost = (cmdcode < 128 ? base_cost : dist_cost) +
              (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + l].u.cost) {
            UpdateZopfliNode(nodes, pos, start, l, l, backward, j + 1, cost);
            result = BROTLI_MAX(size_t, result, l);
          }
          best_len = l;
        }
      }
    }

    /* At higher iterations look only for new last distance matches, since
       looking only for new command start positions with the same distances
       does not help much. */
    if (k >= 2) continue;

    {
      /* Loop through all possible copy lengths at this position. */
      size_t len = min_len;
      for (j = 0; j < num_matches; ++j) {
        BackwardMatch match = matches[j];
        size_t dist = match.distance;
        BROTLI_BOOL is_dictionary_match =
            TO_BROTLI_BOOL(dist > max_distance + gap);
        /* We already tried all possible last distance matches, so we can use
           normal distance code here. */
        size_t dist_code = dist + BROTLI_NUM_DISTANCE_SHORT_CODES - 1;
        uint16_t dist_symbol;
        uint32_t distextra;
        uint32_t distnumextra;
        float dist_cost;
        size_t max_match_len;
        PrefixEncodeCopyDistance(
            dist_code, params->dist.num_direct_distance_codes,
            params->dist.distance_postfix_bits, &dist_symbol, &distextra);
        distnumextra = dist_symbol >> 10;
        dist_cost = base_cost + (float)distnumextra +
            ZopfliCostModelGetDistanceCost(model, dist_symbol & 0x3FF);

        /* Try all copy lengths up until the maximum copy length corresponding
           to this distance. If the distance refers to the static dictionary, or
           the maximum length is long enough, try only one maximum length. */
        max_match_len = BackwardMatchLength(&match);
        if (len < max_match_len &&
            (is_dictionary_match || max_match_len > max_zopfli_len)) {
          len = max_match_len;
        }
        for (; len <= max_match_len; ++len) {
          const size_t len_code =
              is_dictionary_match ? BackwardMatchLengthCode(&match) : len;
          const uint16_t copycode = GetCopyLengthCode(len_code);
          const uint16_t cmdcode = CombineLengthCodes(inscode, copycode, 0);
          const float cost = dist_cost + (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + len].u.cost) {
            UpdateZopfliNode(nodes, pos, start, len, len_code, dist, 0, cost);
            result = BROTLI_MAX(size_t, result, len);
          }
        }
      }
    }
  }
  return result;
}